

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

bool duckdb::Date::TryConvertDateSpecial(char *buf,idx_t len,idx_t *pos,char *special)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  idx_t iVar4;
  ulong uVar5;
  char s;
  byte bVar6;
  
  uVar5 = *pos;
  iVar4 = len;
  if (len < uVar5) {
    iVar4 = uVar5;
  }
  for (; bVar1 = *special, uVar5 < len; uVar5 = uVar5 + 1) {
    if (bVar1 == 0) goto LAB_012a7ce3;
    bVar2 = buf[uVar5];
    bVar6 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar6 = bVar2;
    }
    if (bVar6 != bVar1) goto LAB_012a7cdc;
    special = (char *)((byte *)special + 1);
  }
  uVar5 = iVar4;
  if (bVar1 == 0) {
LAB_012a7ce3:
    *pos = uVar5;
    bVar3 = true;
  }
  else {
LAB_012a7cdc:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Date::TryConvertDateSpecial(const char *buf, idx_t len, idx_t &pos, const char *special) {
	auto p = pos;
	for (; p < len && *special; ++p) {
		const auto s = *special++;
		if (!s || StringUtil::CharacterToLower(buf[p]) != s) {
			return false;
		}
	}
	if (*special) {
		return false;
	}
	pos = p;
	return true;
}